

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.H
# Opt level: O0

void __thiscall Fl_Adjuster::~Fl_Adjuster(Fl_Adjuster *this)

{
  Fl_Adjuster *this_local;
  
  ~Fl_Adjuster(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

class FL_EXPORT Fl_Adjuster : public Fl_Valuator {
  int drag;
  int ix;
  int soft_;
protected:
  void draw();
  int handle(int);
  void value_damage();
public:
  Fl_Adjuster(int X,int Y,int W,int H,const char *l=0);
  /**
    If "soft" is turned on, the user is allowed to drag the value outside
    the range.  If they drag the value to one of the ends, let go, then
    grab again and continue to drag, they can get to any value.  Default is
    one.
  */
  void soft(int s) {soft_ = s;}
  /**
    If "soft" is turned on, the user is allowed to drag the value outside
    the range.  If they drag the value to one of the ends, let go, then
    grab again and continue to drag, they can get to any value.  Default is
    one.
  */
  int soft() const {return soft_;}
}